

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

bin_mdef_t * bin_mdef_read_text(ps_config_t *config,char *filename)

{
  int iVar1;
  mdef_t *m;
  char **ppcVar2;
  size_t sVar3;
  char *pcVar4;
  mdef_entry_t *pmVar5;
  cd_tree_t *pcVar6;
  ph_rc_s *local_78;
  ph_rc_t *rc_1;
  ph_lc_t *lc_1;
  ph_rc_s *ppStack_60;
  int j_1;
  ph_rc_t *rc;
  ph_lc_t *lc;
  int local_48;
  int j;
  int nchars;
  int rc_idx;
  int lc_idx;
  int ci_idx;
  int nodes;
  int i;
  mdef_t *mdef;
  bin_mdef_t *bmdef;
  char *filename_local;
  ps_config_t *config_local;
  
  m = mdef_init(filename,1);
  if (m == (mdef_t *)0x0) {
    config_local = (ps_config_t *)0x0;
  }
  else if (m->n_sen < 0x10000) {
    if (m->n_sseq < 0x10000) {
      if (m->n_ciphone < 0x100) {
        config_local = (ps_config_t *)
                       __ckd_calloc__(1,0x78,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                      ,0x5f);
        ((bin_mdef_t *)config_local)->refcnt = 1;
        ((bin_mdef_t *)config_local)->n_ciphone = m->n_ciphone;
        ((bin_mdef_t *)config_local)->n_phone = m->n_phone;
        ((bin_mdef_t *)config_local)->n_emit_state = m->n_emit_state;
        ((bin_mdef_t *)config_local)->n_ci_sen = m->n_ci_sen;
        ((bin_mdef_t *)config_local)->n_sen = m->n_sen;
        ((bin_mdef_t *)config_local)->n_tmat = m->n_tmat;
        ((bin_mdef_t *)config_local)->n_sseq = m->n_sseq;
        ((bin_mdef_t *)config_local)->sseq = m->sseq;
        ((bin_mdef_t *)config_local)->cd2cisen = m->cd2cisen;
        ((bin_mdef_t *)config_local)->sen2cimap = m->sen2cimap;
        ((bin_mdef_t *)config_local)->n_ctx = 3;
        ((bin_mdef_t *)config_local)->sil = (int)m->sil;
        m->sseq = (uint16 **)0x0;
        m->cd2cisen = (int16 *)0x0;
        m->sen2cimap = (int16 *)0x0;
        ppcVar2 = (char **)__ckd_calloc__((long)((bin_mdef_t *)config_local)->n_ciphone,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x76);
        ((bin_mdef_t *)config_local)->ciname = ppcVar2;
        local_48 = 0;
        for (ci_idx = 0; ci_idx < ((bin_mdef_t *)config_local)->n_ciphone; ci_idx = ci_idx + 1) {
          sVar3 = strlen(m->ciphone[ci_idx].name);
          local_48 = local_48 + (int)sVar3 + 1;
        }
        pcVar4 = (char *)__ckd_calloc__((long)local_48,1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                        ,0x7a);
        *((bin_mdef_t *)config_local)->ciname = pcVar4;
        strcpy(*((bin_mdef_t *)config_local)->ciname,m->ciphone->name);
        for (ci_idx = 1; ci_idx < ((bin_mdef_t *)config_local)->n_ciphone; ci_idx = ci_idx + 1) {
          if (ci_idx < 1) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                          ,0x7d,"bin_mdef_t *bin_mdef_read_text(ps_config_t *, const char *)");
          }
          pcVar4 = ((bin_mdef_t *)config_local)->ciname[ci_idx + -1];
          sVar3 = strlen(((bin_mdef_t *)config_local)->ciname[ci_idx + -1]);
          ((bin_mdef_t *)config_local)->ciname[ci_idx] = pcVar4 + sVar3 + 1;
          strcpy(((bin_mdef_t *)config_local)->ciname[ci_idx],m->ciphone[ci_idx].name);
          iVar1 = strcmp(((bin_mdef_t *)config_local)->ciname[ci_idx + -1],
                         ((bin_mdef_t *)config_local)->ciname[ci_idx]);
          if (0 < iVar1) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                    ,0x83,"Phone names are not in sorted order, sorry.");
            bin_mdef_free((bin_mdef_t *)config_local);
            mdef_free(m);
            return (bin_mdef_t *)0x0;
          }
        }
        pmVar5 = (mdef_entry_t *)
                 __ckd_calloc__((long)((bin_mdef_t *)config_local)->n_phone,0xc,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                ,0x8b);
        ((bin_mdef_t *)config_local)->phone = pmVar5;
        for (ci_idx = 0; ci_idx < m->n_phone; ci_idx = ci_idx + 1) {
          ((bin_mdef_t *)config_local)->phone[ci_idx].ssid = m->phone[ci_idx].ssid;
          ((bin_mdef_t *)config_local)->phone[ci_idx].tmat = m->phone[ci_idx].tmat;
          if (ci_idx < ((bin_mdef_t *)config_local)->n_ciphone) {
            ((bin_mdef_t *)config_local)->phone[ci_idx].info.ci.filler =
                 (uint8)m->ciphone[ci_idx].filler;
          }
          else {
            ((bin_mdef_t *)config_local)->phone[ci_idx].info.ci.filler =
                 (uint8)m->phone[ci_idx].wpos;
            ((bin_mdef_t *)config_local)->phone[ci_idx].info.ci.reserved[0] =
                 (uint8)m->phone[ci_idx].ci;
            ((bin_mdef_t *)config_local)->phone[ci_idx].info.ci.reserved[1] =
                 (uint8)m->phone[ci_idx].lc;
            ((bin_mdef_t *)config_local)->phone[ci_idx].info.ci.reserved[2] =
                 (uint8)m->phone[ci_idx].rc;
          }
        }
        j = 0;
        rc_idx = 0;
        nchars = 0;
        lc_idx = 0;
        for (ci_idx = 0; ci_idx < 4; ci_idx = ci_idx + 1) {
          for (lc._4_4_ = 0; lc._4_4_ < m->n_ciphone; lc._4_4_ = lc._4_4_ + 1) {
            for (rc = (ph_rc_t *)m->wpos_ci_lclist[ci_idx][lc._4_4_]; rc != (ph_rc_t *)0x0;
                rc = *(ph_rc_t **)(rc + 1)) {
              for (ppStack_60 = rc->next; ppStack_60 != (ph_rc_s *)0x0;
                  ppStack_60 = ppStack_60->next) {
                lc_idx = lc_idx + 1;
              }
              lc_idx = lc_idx + 1;
              j = j + 1;
            }
            lc_idx = lc_idx + 1;
            nchars = nchars + 1;
            j = j + 1;
          }
          lc_idx = lc_idx + 1;
          rc_idx = rc_idx + 1;
          nchars = nchars + 1;
          j = j + 1;
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0xb5,"Allocating %d * %d bytes (%d KiB) for CD tree\n",(ulong)(uint)lc_idx,8,
                (ulong)((long)lc_idx << 3) >> 10);
        ((bin_mdef_t *)config_local)->n_cd_tree = lc_idx;
        pcVar6 = (cd_tree_t *)
                 __ckd_calloc__((long)lc_idx,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                ,0xb7);
        ((bin_mdef_t *)config_local)->cd_tree = pcVar6;
        for (ci_idx = 0; ci_idx < 4; ci_idx = ci_idx + 1) {
          ((bin_mdef_t *)config_local)->cd_tree[ci_idx].ctx = (int16)ci_idx;
          ((bin_mdef_t *)config_local)->cd_tree[ci_idx].n_down = (int16)m->n_ciphone;
          ((bin_mdef_t *)config_local)->cd_tree[ci_idx].c.pid = rc_idx;
          for (lc_1._4_4_ = 0; lc_1._4_4_ < m->n_ciphone; lc_1._4_4_ = lc_1._4_4_ + 1) {
            ((bin_mdef_t *)config_local)->cd_tree[rc_idx].ctx = (int16)lc_1._4_4_;
            ((bin_mdef_t *)config_local)->cd_tree[rc_idx].c.pid = nchars;
            for (rc_1 = (ph_rc_t *)m->wpos_ci_lclist[ci_idx][lc_1._4_4_]; rc_1 != (ph_rc_t *)0x0;
                rc_1 = *(ph_rc_t **)(rc_1 + 1)) {
              ((bin_mdef_t *)config_local)->cd_tree[nchars].ctx = rc_1->rc;
              ((bin_mdef_t *)config_local)->cd_tree[nchars].c.pid = j;
              for (local_78 = rc_1->next; local_78 != (ph_rc_s *)0x0; local_78 = local_78->next) {
                ((bin_mdef_t *)config_local)->cd_tree[j].ctx = local_78->rc;
                ((bin_mdef_t *)config_local)->cd_tree[j].n_down = 0;
                ((bin_mdef_t *)config_local)->cd_tree[j].c =
                     (anon_union_4_2_61eccf2c_for_c)local_78->pid;
                ((bin_mdef_t *)config_local)->cd_tree[nchars].n_down =
                     ((bin_mdef_t *)config_local)->cd_tree[nchars].n_down + 1;
                j = j + 1;
              }
              if (((bin_mdef_t *)config_local)->cd_tree[nchars].n_down == 0) {
                ((bin_mdef_t *)config_local)->cd_tree[nchars].c.pid = -1;
              }
              ((bin_mdef_t *)config_local)->cd_tree[rc_idx].n_down =
                   ((bin_mdef_t *)config_local)->cd_tree[rc_idx].n_down + 1;
              nchars = nchars + 1;
            }
            if (((bin_mdef_t *)config_local)->cd_tree[rc_idx].n_down == 0) {
              ((bin_mdef_t *)config_local)->cd_tree[rc_idx].c.pid = -1;
            }
            rc_idx = rc_idx + 1;
          }
        }
        mdef_free(m);
        ((bin_mdef_t *)config_local)->alloc_mode = BIN_MDEF_FROM_TEXT;
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x5a,"Number of phones exceeds limit: %d > %d\n",(ulong)(uint)m->n_ciphone,0xff);
        mdef_free(m);
        config_local = (ps_config_t *)0x0;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
              ,0x53,"Number of senone sequences exceeds limit: %d > %d\n",(ulong)(uint)m->n_sseq,
              0xffff);
      mdef_free(m);
      config_local = (ps_config_t *)0x0;
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x4d,"Number of senones exceeds limit: %d > %d\n",(ulong)(uint)m->n_sen,0xffff);
    mdef_free(m);
    config_local = (ps_config_t *)0x0;
  }
  return (bin_mdef_t *)config_local;
}

Assistant:

bin_mdef_t *
bin_mdef_read_text(ps_config_t *config, const char *filename)
{
    bin_mdef_t *bmdef;
    mdef_t *mdef;
    int i, nodes, ci_idx, lc_idx, rc_idx;
    int nchars;

    (void)config;

    if ((mdef = mdef_init((char *) filename, TRUE)) == NULL)
        return NULL;

    /* Enforce some limits.  */
    if (mdef->n_sen > BAD_SENID) {
        E_ERROR("Number of senones exceeds limit: %d > %d\n",
                mdef->n_sen, BAD_SENID);
        mdef_free(mdef);
        return NULL;
    }
    if (mdef->n_sseq > BAD_SSID) {
        E_ERROR("Number of senone sequences exceeds limit: %d > %d\n",
                mdef->n_sseq, BAD_SSID);
        mdef_free(mdef);
        return NULL;
    }
    /* We use uint8 for ciphones */
    if (mdef->n_ciphone > 255) {
        E_ERROR("Number of phones exceeds limit: %d > %d\n",
                mdef->n_ciphone, 255);
        mdef_free(mdef);
        return NULL;
    }

    bmdef = ckd_calloc(1, sizeof(*bmdef));
    bmdef->refcnt = 1;

    /* Easy stuff.  The mdef.c code has done the heavy lifting for us. */
    bmdef->n_ciphone = mdef->n_ciphone;
    bmdef->n_phone = mdef->n_phone;
    bmdef->n_emit_state = mdef->n_emit_state;
    bmdef->n_ci_sen = mdef->n_ci_sen;
    bmdef->n_sen = mdef->n_sen;
    bmdef->n_tmat = mdef->n_tmat;
    bmdef->n_sseq = mdef->n_sseq;
    bmdef->sseq = mdef->sseq;
    bmdef->cd2cisen = mdef->cd2cisen;
    bmdef->sen2cimap = mdef->sen2cimap;
    bmdef->n_ctx = 3;           /* Triphones only. */
    bmdef->sil = mdef->sil;
    mdef->sseq = NULL;          /* We are taking over this one. */
    mdef->cd2cisen = NULL;      /* And this one. */
    mdef->sen2cimap = NULL;     /* And this one. */

    /* Get the phone names.  If they are not sorted
     * ASCII-betically then we are in a world of hurt and
     * therefore will simply refuse to continue. */
    bmdef->ciname = ckd_calloc(bmdef->n_ciphone, sizeof(*bmdef->ciname));
    nchars = 0;
    for (i = 0; i < bmdef->n_ciphone; ++i)
        nchars += strlen(mdef->ciphone[i].name) + 1;
    bmdef->ciname[0] = ckd_calloc(nchars, 1);
    strcpy(bmdef->ciname[0], mdef->ciphone[0].name);
    for (i = 1; i < bmdef->n_ciphone; ++i) {
        assert(i > 0); /* No reason to imagine it wouldn't be, but... */
        bmdef->ciname[i] =
            bmdef->ciname[i - 1] + strlen(bmdef->ciname[i - 1]) + 1;
        strcpy(bmdef->ciname[i], mdef->ciphone[i].name);
        if (strcmp(bmdef->ciname[i - 1], bmdef->ciname[i]) > 0) {
            /* FIXME: there should be a solution to this, actually. */
            E_ERROR("Phone names are not in sorted order, sorry.");
            bin_mdef_free(bmdef);
            mdef_free(mdef);
            return NULL;
        }
    }

    /* Copy over phone information. */
    bmdef->phone = ckd_calloc(bmdef->n_phone, sizeof(*bmdef->phone));
    for (i = 0; i < mdef->n_phone; ++i) {
        bmdef->phone[i].ssid = mdef->phone[i].ssid;
        bmdef->phone[i].tmat = mdef->phone[i].tmat;
        if (i < bmdef->n_ciphone) {
            bmdef->phone[i].info.ci.filler = mdef->ciphone[i].filler;
        }
        else {
            bmdef->phone[i].info.cd.wpos = mdef->phone[i].wpos;
            bmdef->phone[i].info.cd.ctx[0] = mdef->phone[i].ci;
            bmdef->phone[i].info.cd.ctx[1] = mdef->phone[i].lc;
            bmdef->phone[i].info.cd.ctx[2] = mdef->phone[i].rc;
        }
    }

    /* Walk the wpos_ci_lclist once to find the total number of
     * nodes and the starting locations for each level. */
    nodes = lc_idx = ci_idx = rc_idx = 0;
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    ++nodes;    /* RC node */
                }
                ++nodes;        /* LC node */
                ++rc_idx;       /* Start of RC nodes (after LC nodes) */
            }
            ++nodes;            /* CI node */
            ++lc_idx;           /* Start of LC nodes (after CI nodes) */
            ++rc_idx;           /* Start of RC nodes (after CI and LC nodes) */
        }
        ++nodes;                /* wpos node */
        ++ci_idx;               /* Start of CI nodes (after wpos nodes) */
        ++lc_idx;               /* Start of LC nodes (after CI nodes) */
        ++rc_idx;               /* STart of RC nodes (after wpos, CI, and LC nodes) */
    }
    E_INFO("Allocating %d * %d bytes (%d KiB) for CD tree\n",
           nodes, sizeof(*bmdef->cd_tree), 
           nodes * sizeof(*bmdef->cd_tree) / 1024);
    bmdef->n_cd_tree = nodes;
    bmdef->cd_tree = ckd_calloc(nodes, sizeof(*bmdef->cd_tree));
    for (i = 0; i < N_WORD_POSN; ++i) {
        int j;

        bmdef->cd_tree[i].ctx = i;
        bmdef->cd_tree[i].n_down = mdef->n_ciphone;
        bmdef->cd_tree[i].c.down = ci_idx;
#if 0
        E_INFO("%d => %c (%d@%d)\n",
               i, (WPOS_NAME)[i],
               bmdef->cd_tree[i].n_down, bmdef->cd_tree[i].c.down);
#endif

        /* Now we can build the rest of the tree. */
        for (j = 0; j < mdef->n_ciphone; ++j) {
            ph_lc_t *lc;

            bmdef->cd_tree[ci_idx].ctx = j;
            bmdef->cd_tree[ci_idx].c.down = lc_idx;
            for (lc = mdef->wpos_ci_lclist[i][j]; lc; lc = lc->next) {
                ph_rc_t *rc;

                bmdef->cd_tree[lc_idx].ctx = lc->lc;
                bmdef->cd_tree[lc_idx].c.down = rc_idx;
                for (rc = lc->rclist; rc; rc = rc->next) {
                    bmdef->cd_tree[rc_idx].ctx = rc->rc;
                    bmdef->cd_tree[rc_idx].n_down = 0;
                    bmdef->cd_tree[rc_idx].c.pid = rc->pid;
#if 0
                    E_INFO("%d => %s %s %s %c (%d@%d)\n",
                           rc_idx,
                           bmdef->ciname[j],
                           bmdef->ciname[lc->lc],
                           bmdef->ciname[rc->rc],
                           (WPOS_NAME)[i],
                           bmdef->cd_tree[rc_idx].n_down,
                           bmdef->cd_tree[rc_idx].c.down);
#endif

                    ++bmdef->cd_tree[lc_idx].n_down;
                    ++rc_idx;
                }
                /* If there are no triphones here,
                 * this is considered a leafnode, so
                 * set the pid to -1. */
                if (bmdef->cd_tree[lc_idx].n_down == 0)
                    bmdef->cd_tree[lc_idx].c.pid = -1;
#if 0
                E_INFO("%d => %s %s %c (%d@%d)\n",
                       lc_idx,
                       bmdef->ciname[j],
                       bmdef->ciname[lc->lc],
                       (WPOS_NAME)[i],
                       bmdef->cd_tree[lc_idx].n_down,
                       bmdef->cd_tree[lc_idx].c.down);
#endif

                ++bmdef->cd_tree[ci_idx].n_down;
                ++lc_idx;
            }

            /* As above, so below. */
            if (bmdef->cd_tree[ci_idx].n_down == 0)
                bmdef->cd_tree[ci_idx].c.pid = -1;
#if 0
            E_INFO("%d => %d=%s (%d@%d)\n",
                   ci_idx, j, bmdef->ciname[j],
                   bmdef->cd_tree[ci_idx].n_down,
                   bmdef->cd_tree[ci_idx].c.down);
#endif

            ++ci_idx;
        }
    }

    mdef_free(mdef);

    bmdef->alloc_mode = BIN_MDEF_FROM_TEXT;
    return bmdef;
}